

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintString
          (string *__return_storage_ptr__,FieldValuePrinter *this,string *val)

{
  StringBaseTextGenerator generator;
  BaseTextGenerator local_40;
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  local_40._vptr_BaseTextGenerator = (_func_int **)&PTR__StringBaseTextGenerator_004e4650;
  local_30 = 0;
  local_28[0] = 0;
  local_38 = local_28;
  FastFieldValuePrinter::PrintString((FastFieldValuePrinter *)__return_storage_ptr__,val,&local_40);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_38,local_38 + local_30);
  local_40._vptr_BaseTextGenerator = (_func_int **)&PTR__StringBaseTextGenerator_004e4650;
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TextFormat::FieldValuePrinter::PrintString(
    const std::string& val) const {
  FORWARD_IMPL(PrintString, val);
}